

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

ym2612_ * YM2612_Init(UINT32 Clock,UINT32 Rate,UINT8 Interpolation)

{
  ulong *puVar1;
  undefined1 auVar2 [13];
  int iVar3;
  ym2612_ *pyVar4;
  uint *puVar5;
  int (*paiVar6) [32];
  ulong uVar7;
  UINT8 (*paUVar8) [32];
  int *piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar18;
  int iVar19;
  undefined1 auVar17 [16];
  double dVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  double dVar26;
  double dVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  if ((Clock == 0 || Rate == 0) || (pyVar4 = (ym2612_ *)calloc(1,0x4958), pyVar4 == (ym2612_ *)0x0))
  {
    pyVar4 = (ym2612_ *)0x0;
  }
  else {
    pyVar4->Clock = Clock;
    pyVar4->Rate = Rate;
    dVar20 = ((double)(int)Clock / (double)(int)Rate) / 144.0;
    pyVar4->Frequence = dVar20;
    pyVar4->TimerBase = (int)(dVar20 * 4096.0);
    uVar22 = 0x4000;
    if ((Interpolation != '\0') && (1.0 < dVar20)) {
      uVar22 = (uint)(long)((1.0 / dVar20) * 16384.0);
      pyVar4->Rate = (int)Clock / 0x90;
      pyVar4->Frequence = 1.0;
      dVar20 = 1.0;
    }
    pyVar4->Inter_Step = uVar22;
    uVar11 = 0;
    piVar9 = TL_TAB;
    do {
      if (uVar11 < 0xd00) {
        dVar13 = pow(10.0,((double)(int)uVar11 * 0.0234375) / 20.0);
        *piVar9 = (int)(268435455.0 / dVar13);
        iVar3 = -(int)(268435455.0 / dVar13);
        uVar7 = uVar11 | 0x3000;
      }
      else {
        *piVar9 = 0;
        uVar7 = uVar11 + 0x3000;
        iVar3 = 0;
      }
      TL_TAB[uVar7] = iVar3;
      uVar11 = uVar11 + 1;
      piVar9 = piVar9 + 1;
    } while (uVar11 != 0x3000);
    SIN_TAB[0x800] = TL_TAB + 0xd00;
    SIN_TAB[0] = TL_TAB + 0xd00;
    lVar10 = 1;
    lVar12 = 0x7ff;
    do {
      dVar13 = sin((double)(int)lVar10 * 6.283185307179586 * 0.000244140625);
      dVar13 = log10(1.0 / dVar13);
      iVar3 = (int)((dVar13 * 20.0) / 0.0234375);
      if (0xcff < iVar3) {
        iVar3 = 0xd00;
      }
      SIN_TAB[lVar12] = TL_TAB + iVar3;
      SIN_TAB[lVar10] = TL_TAB + iVar3;
      piVar9 = (int *)((long)iVar3 * 4 + 0x1f58b0);
      SIN_TAB[lVar12 + 0x800] = piVar9;
      SIN_TAB[lVar10 + 0x800] = piVar9;
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0x3ff);
    lVar12 = 0;
    lVar10 = 0;
    do {
      dVar13 = (double)(int)lVar10 * 6.283185307179586 * 0.0009765625;
      dVar14 = sin(dVar13);
      *(int *)((long)LFO_ENV_TAB + lVar12) = (int)((dVar14 + 1.0) * 0.5 * 503.4666666666667);
      dVar13 = sin(dVar13);
      *(int *)((long)LFO_FREQ_TAB + lVar12) = (int)(dVar13 * 511.0);
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 4;
    } while (lVar10 != 0x400);
    iVar3 = 0xfff;
    lVar10 = 0;
    do {
      dVar13 = pow((double)iVar3 * 0.000244140625,8.0);
      ENV_TAB[lVar10] = (int)(dVar13 * 4096.0);
      ENV_TAB[lVar10 + 0x1000] = (int)((double)(int)lVar10 * 0.000244140625 * 4096.0);
      lVar10 = lVar10 + 1;
      iVar3 = iVar3 + -1;
    } while (lVar10 != 0x1000);
    ENV_TAB[0x2000] = 0xfff;
    iVar3 = 0xfff;
    uVar11 = 0;
    do {
      iVar16 = 0;
      if (iVar3 != 0) {
        lVar10 = 0;
        do {
          if (uVar11 <= ENV_TAB[lVar10 + iVar3]) {
            iVar16 = iVar3 + (int)lVar10;
            goto LAB_00132cec;
          }
          lVar10 = lVar10 + -1;
        } while (-lVar10 != (long)iVar3);
        iVar16 = 0;
      }
LAB_00132cec:
      iVar3 = iVar16;
      DECAY_TO_ATTACK[uVar11] = iVar3 << 0x10;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x1000);
    puVar5 = SL_TAB + 1;
    lVar10 = 0;
    auVar15 = _DAT_00172600;
    do {
      if (SUB164(auVar15 ^ _DAT_00172610,4) == -0x80000000 &&
          SUB164(auVar15 ^ _DAT_00172610,0) < -0x7ffffff1) {
        puVar5[-1] = (int)((double)(int)lVar10 / 0.0234375) * 0x10000 + 0x10000000;
        *puVar5 = (int)((double)((int)lVar10 + 3) / 0.0234375) * 0x10000 + 0x10000000;
      }
      auVar17 = _DAT_00173150;
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar12 + 2;
      puVar5 = puVar5 + 2;
      lVar10 = lVar10 + 6;
    } while (lVar10 != 0x30);
    SL_TAB[0xf] = 0x1fff0000;
    lVar10 = 0x464;
    auVar33 = _DAT_00173140;
    do {
      uVar22 = auVar33._8_4_;
      auVar36._4_4_ = 0;
      auVar36._0_4_ = uVar22;
      iVar16 = auVar33._12_4_;
      auVar36._8_4_ = iVar16;
      auVar36._12_4_ = 0;
      iVar3 = auVar33._4_4_;
      auVar35._0_8_ = auVar33._0_8_ & 0xffffffff;
      auVar35._8_4_ = iVar3;
      auVar35._12_4_ = 0;
      dVar13 = (SUB168(auVar35 | auVar17,0) - auVar17._0_8_) * dVar20 * 4096.0 * 0.5;
      dVar14 = (SUB168(auVar35 | auVar17,8) - auVar17._8_8_) * dVar20 * 4096.0 * 0.5;
      dVar26 = (SUB168(auVar36 | auVar17,0) - auVar17._0_8_) * dVar20 * 4096.0 * 0.5;
      dVar27 = (SUB168(auVar36 | auVar17,8) - auVar17._8_8_) * dVar20 * 4096.0 * 0.5;
      iVar28 = (int)dVar26;
      iVar30 = (int)dVar27;
      iVar29 = (int)dVar13;
      iVar31 = (int)dVar14;
      piVar9 = pyVar4->CHANNEL[0].S0_OUT + lVar10 + -0x18;
      *(ulong *)piVar9 =
           CONCAT44((int)(dVar14 - 2147483648.0),(int)(dVar13 - 2147483648.0)) &
           CONCAT44(iVar31 >> 0x1f,iVar29 >> 0x1f) | CONCAT44(iVar31,iVar29);
      *(ulong *)(piVar9 + 2) =
           CONCAT44((int)(dVar27 - 2147483648.0),(int)(dVar26 - 2147483648.0)) &
           CONCAT44(iVar30 >> 0x1f,iVar28 >> 0x1f) | CONCAT44(iVar30,iVar28);
      auVar33._0_4_ = auVar33._0_4_ + 4;
      auVar33._4_4_ = iVar3 + 4;
      auVar33._8_4_ = uVar22 + 4;
      auVar33._12_4_ = iVar16 + 4;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xc64);
    pyVar4->AR_TAB[0] = 0;
    pyVar4->AR_TAB[1] = 0;
    pyVar4->AR_TAB[2] = 0;
    pyVar4->AR_TAB[3] = 0;
    pyVar4->DR_TAB[0] = 0;
    auVar17 = _DAT_00177700;
    auVar15 = _DAT_001776f0;
    pyVar4->DR_TAB[1] = 0;
    pyVar4->DR_TAB[2] = 0;
    pyVar4->DR_TAB[3] = 0;
    uVar22 = 0;
    uVar23 = 1;
    uVar24 = 2;
    uVar25 = 3;
    lVar10 = 0xce8;
    do {
      auVar34._0_8_ =
           (double)(int)(float)((uVar22 >> 2) * 0x800000 + 0x3f800000) * dVar20 * 1.0 * 268435456.0;
      auVar34._8_8_ =
           (double)(int)(float)((uVar23 >> 2) * 0x800000 + 0x3f800000) *
           ((double)(uVar23 & 3) * 0.25 + 1.0) * dVar20 * 268435456.0;
      auVar32._0_8_ =
           (double)(int)(float)((uVar24 >> 2) * 0x800000 + 0x3f800000) *
           ((double)(uVar24 & 3) * 0.25 + 1.0) * dVar20 * 268435456.0;
      auVar32._8_8_ =
           (double)(int)(float)((uVar25 >> 2) * 0x800000 + 0x3f800000) *
           ((double)(uVar25 & 3) * 0.25 + 1.0) * dVar20 * 268435456.0;
      auVar37._8_8_ = auVar32._8_8_;
      auVar37._0_8_ = auVar32._0_8_;
      auVar38._8_8_ = auVar34._8_8_;
      auVar38._0_8_ = auVar34._0_8_;
      auVar36 = divpd(auVar38,auVar15);
      iVar28 = (int)auVar36._0_8_;
      iVar31 = (int)auVar36._8_8_;
      auVar38 = divpd(auVar37,auVar15);
      iVar3 = (int)auVar38._0_8_;
      iVar16 = (int)auVar38._8_8_;
      auVar35 = divpd(auVar34,auVar17);
      iVar29 = (int)auVar35._0_8_;
      iVar18 = (int)auVar35._8_8_;
      auVar33 = divpd(auVar32,auVar17);
      iVar30 = (int)auVar33._0_8_;
      iVar19 = (int)auVar33._8_8_;
      puVar1 = (ulong *)((long)pyVar4 + lVar10 * 4 + -0x200);
      *puVar1 = CONCAT44((int)(auVar36._8_8_ - 2147483648.0),(int)(auVar36._0_8_ - 2147483648.0)) &
                CONCAT44(iVar31 >> 0x1f,iVar28 >> 0x1f) | CONCAT44(iVar31,iVar28);
      puVar1[1] = CONCAT44((int)(auVar38._8_8_ - 2147483648.0),(int)(auVar38._0_8_ - 2147483648.0))
                  & CONCAT44(iVar16 >> 0x1f,iVar3 >> 0x1f) | CONCAT44(iVar16,iVar3);
      piVar9 = pyVar4->CHANNEL[0].S0_OUT + lVar10 + -0x18;
      *(ulong *)piVar9 =
           CONCAT44((int)(auVar35._8_8_ - 2147483648.0),(int)(auVar35._0_8_ - 2147483648.0)) &
           CONCAT44(iVar18 >> 0x1f,iVar29 >> 0x1f) | CONCAT44(iVar18,iVar29);
      *(ulong *)(piVar9 + 2) =
           CONCAT44((int)(auVar33._8_8_ - 2147483648.0),(int)(auVar33._0_8_ - 2147483648.0)) &
           CONCAT44(iVar19 >> 0x1f,iVar30 >> 0x1f) | CONCAT44(iVar19,iVar30);
      uVar22 = uVar22 + 4;
      uVar23 = uVar23 + 4;
      uVar24 = uVar24 + 4;
      uVar25 = uVar25 + 4;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xd24);
    NULL_RATE[0x1c] = 0;
    NULL_RATE[0x1d] = 0;
    NULL_RATE[0x1e] = 0;
    NULL_RATE[0x1f] = 0;
    NULL_RATE[0x18] = 0;
    NULL_RATE[0x19] = 0;
    NULL_RATE[0x1a] = 0;
    NULL_RATE[0x1b] = 0;
    NULL_RATE[0x14] = 0;
    NULL_RATE[0x15] = 0;
    NULL_RATE[0x16] = 0;
    NULL_RATE[0x17] = 0;
    NULL_RATE[0x10] = 0;
    NULL_RATE[0x11] = 0;
    NULL_RATE[0x12] = 0;
    NULL_RATE[0x13] = 0;
    NULL_RATE[0xc] = 0;
    NULL_RATE[0xd] = 0;
    NULL_RATE[0xe] = 0;
    NULL_RATE[0xf] = 0;
    NULL_RATE[8] = 0;
    NULL_RATE[9] = 0;
    NULL_RATE[10] = 0;
    NULL_RATE[0xb] = 0;
    NULL_RATE[4] = 0;
    NULL_RATE[5] = 0;
    NULL_RATE[6] = 0;
    NULL_RATE[7] = 0;
    NULL_RATE[0] = 0;
    NULL_RATE[1] = 0;
    NULL_RATE[2] = 0;
    NULL_RATE[3] = 0;
    uVar22 = pyVar4->AR_TAB[0x3f];
    lVar10 = 0xd24;
    do {
      puVar5 = (uint *)((long)pyVar4 + lVar10 * 4 + -0x200);
      *puVar5 = uVar22;
      puVar5[1] = uVar22;
      puVar5[2] = uVar22;
      puVar5[3] = uVar22;
      uVar23 = pyVar4->DR_TAB[0x3f];
      piVar9 = pyVar4->CHANNEL[0].S0_OUT + lVar10 + -0x18;
      *piVar9 = uVar23;
      piVar9[1] = uVar23;
      piVar9[2] = uVar23;
      piVar9[3] = uVar23;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xd44);
    paiVar6 = pyVar4->DT_TAB + 4;
    paUVar8 = DT_DEF_TAB;
    lVar10 = 0;
    do {
      lVar12 = 0;
      do {
        uVar22 = *(uint *)(*paUVar8 + lVar12);
        auVar2[0xc] = (char)(uVar22 >> 0x18);
        auVar2._0_12_ = ZEXT712(0);
        dVar26 = (double)(int)CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar22 >> 0x10)) * dVar20 * 32.0
        ;
        dVar27 = (double)(uint3)(auVar2._10_3_ >> 0x10) * dVar20 * 32.0;
        dVar13 = (double)(uVar22 & 0xff) * dVar20 * 32.0;
        dVar14 = (double)(uVar22 >> 8 & 0xff) * dVar20 * 32.0;
        *(ulong *)(paiVar6[-4] + lVar12) = CONCAT44((int)dVar14,(int)dVar13);
        *(ulong *)(paiVar6[-4] + lVar12 + 2) = CONCAT44((int)dVar27,(int)dVar26);
        *(ulong *)(*paiVar6 + lVar12) = CONCAT44((int)-dVar14,(int)-dVar13);
        *(ulong *)(*paiVar6 + lVar12 + 2) = CONCAT44((int)-dVar27,(int)-dVar26);
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x20);
      lVar10 = lVar10 + 1;
      paUVar8 = paUVar8 + 1;
      paiVar6 = paiVar6 + 1;
    } while (lVar10 != 4);
    auVar21._0_8_ = (double)(pyVar4->Inter_Step * pyVar4->Rate >> 0xe);
    auVar21._8_8_ = auVar21._0_8_;
    auVar15 = divpd(_DAT_00177730,auVar21);
    auVar17 = divpd(_DAT_00177740,auVar21);
    iVar3 = (int)auVar17._0_8_;
    iVar28 = (int)auVar17._8_8_;
    iVar16 = (int)auVar15._0_8_;
    iVar29 = (int)auVar15._8_8_;
    *(ulong *)pyVar4->LFO_INC_TAB =
         CONCAT44((int)(auVar15._8_8_ - 2147483648.0),(int)(auVar15._0_8_ - 2147483648.0)) &
         CONCAT44(iVar29 >> 0x1f,iVar16 >> 0x1f) | CONCAT44(iVar29,iVar16);
    *(ulong *)(pyVar4->LFO_INC_TAB + 2) =
         CONCAT44((int)(auVar17._8_8_ - 2147483648.0),(int)(auVar17._0_8_ - 2147483648.0)) &
         CONCAT44(iVar28 >> 0x1f,iVar3 >> 0x1f) | CONCAT44(iVar28,iVar3);
    auVar15 = divpd(_DAT_00177750,auVar21);
    auVar17 = divpd(_DAT_00177760,auVar21);
    iVar3 = (int)auVar17._0_8_;
    iVar28 = (int)auVar17._8_8_;
    iVar16 = (int)auVar15._0_8_;
    iVar29 = (int)auVar15._8_8_;
    *(ulong *)(pyVar4->LFO_INC_TAB + 4) =
         CONCAT44((int)(auVar15._8_8_ - 2147483648.0),(int)(auVar15._0_8_ - 2147483648.0)) &
         CONCAT44(iVar29 >> 0x1f,iVar16 >> 0x1f) | CONCAT44(iVar29,iVar16);
    *(ulong *)(pyVar4->LFO_INC_TAB + 6) =
         CONCAT44((int)(auVar17._8_8_ - 2147483648.0),(int)(auVar17._0_8_ - 2147483648.0)) &
         CONCAT44(iVar28 >> 0x1f,iVar3 >> 0x1f) | CONCAT44(iVar28,iVar3);
    auVar15 = _DAT_00172610;
    lVar10 = 0x568;
    auVar17 = _DAT_00172600;
    do {
      if (SUB164(auVar17 ^ auVar15,4) == -0x80000000 && SUB164(auVar17 ^ auVar15,0) < -0x7ffffffa) {
        *(undefined1 *)((long)pyVar4 + lVar10 + -0x288) = 0;
        *(undefined1 *)((long)pyVar4->CHANNEL[0].S0_OUT + lVar10 + -0x60) = 0;
      }
      lVar12 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar12 + 2;
      lVar10 = lVar10 + 0x510;
    } while (lVar10 != 0x1498);
  }
  return pyVar4;
}

Assistant:

ym2612_ *YM2612_Init(UINT32 Clock, UINT32 Rate, UINT8 Interpolation)
{
  ym2612_ *YM2612;
  int i, j;
  double x;

  if ((Rate == 0) || (Clock == 0))
    return NULL;

  YM2612 = (ym2612_ *)calloc(1, sizeof(ym2612_));
  if (YM2612 == NULL)
    return YM2612;

#if YM_DEBUG_LEVEL > 0
  if (debug_file == NULL)
  {
    debug_file = fopen("ym2612.log", "w");
    fprintf(debug_file, "YM2612 logging :\n\n");
  }
#endif

  YM2612->Clock = Clock;
  YM2612->Rate = Rate;

  YM2612->DAC_Highpass_Enable = 0;
  YM2612->Enable_SSGEG = 0;

  // 144 = 12 * (prescale * 2) = 12 * 6 * 2
  // prescale set to 6 by default

  YM2612->Frequence = ((double)(YM2612->Clock) / (double)(YM2612->Rate)) / 144.0;
  YM2612->TimerBase = (int) (YM2612->Frequence * 4096.0);

  if ((Interpolation) && (YM2612->Frequence > 1.0))
  {
    YM2612->Inter_Step = (unsigned int) ((1.0 / YM2612->Frequence) * (double) (0x4000));
    YM2612->Inter_Cnt = 0;

    // We recalculate rate and frequence after interpolation

    YM2612->Rate = YM2612->Clock / 144;
    YM2612->Frequence = 1.0;
  }
  else
  {
    YM2612->Inter_Step = 0x4000;
    YM2612->Inter_Cnt = 0;
  }

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "YM2612 frequence = %g rate = %d  interp step = %.8X\n\n", YM2612->Frequence, YM2612->Rate, YM2612->Inter_Step);
#endif

  // Tableau TL :
  // [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
  // [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)

  for (i = 0; i < TL_LENGTH; i++)
  {
    if (i >= PG_CUT_OFF)  // YM2612 cut off sound after 78 dB (14 bits output ?)
    {
      TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
    }
    else
    {
      x = MAX_OUT;                // Max output
      x /= pow(10, (ENV_STEP * i) / 20);      // Decibel -> Voltage

      TL_TAB[i] = (int) x;
      TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
    }

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X\n", i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau SIN :
  // SIN_TAB[x][y] = sin(x) * y;
  // x = phase and y = volume

  SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int) PG_CUT_OFF];

  for (i = 1; i <= SIN_LENGTH / 4; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (SIN_LENGTH));  // Sinus
    x = 20 * log10(1 / x);                    // convert to dB

    j = (int) (x / ENV_STEP);            // Get TL range

    if (j > PG_CUT_OFF)
      j = (int) PG_CUT_OFF;

    SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
    SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X\n", i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i, SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i, SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i, SIN_TAB[SIN_LENGTH - i][0]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau LFO (LFO wav) :

  for (i = 0; i < LFO_LENGTH; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x += 1.0;
    x /= 2.0;          // positive only
    x *= 11.8 / ENV_STEP;    // ajusted to MAX enveloppe modulation

    LFO_ENV_TAB[i] = (int) x;

    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

    LFO_FREQ_TAB[i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "LFO[%d] = %.8X\n", i, LFO_ENV_TAB[i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau Enveloppe :
  // ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]        = attack curve
  // ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1]  = decay curve

  for (i = 0; i < ENV_LENGTH; i++)
  {
    // Attack curve (x^8 - music level 2 Vectorman 2)
    x = pow(((double) ((ENV_LENGTH - 1) - i) / (double) (ENV_LENGTH)), 8);
    x *= ENV_LENGTH;

    ENV_TAB[i] = (int) x;

    // Decay curve (just linear)
    x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
    x *= ENV_LENGTH;

    ENV_TAB[ENV_LENGTH + i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "ATTACK[%d] = %d   DECAY[%d] = %d\n", i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
#endif
  }

  ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;    // for the stopped state

  // Tableau pour la conversion Attack -> Decay and Decay -> Attack

  for (i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++)
  {
    while (j && (ENV_TAB[j] < (unsigned) i))
      j--;

    DECAY_TO_ATTACK[i] = j << ENV_LBITS;
  }

  // Tableau pour le Substain Level

  for (i = 0; i < 15; i++)
  {
    x = i * 3;          // 3 and not 6 (Mickey Mania first music for test)
    x /= ENV_STEP;

    j = (int) x;
    j <<= ENV_LBITS;

    SL_TAB[i] = j + ENV_DECAY;
  }

  j = ENV_LENGTH - 1;        // special case : volume off
  j <<= ENV_LBITS;
  SL_TAB[15] = j + ENV_DECAY;

  // Tableau Frequency Step

  for (i = 0; i < 2048; i++)
  {
    x = (double) (i) * YM2612->Frequence;

    #if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
      x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
    #else
      x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
    #endif

    x /= 2.0;  // because MUL = value * 2

    YM2612->FINC_TAB[i] = (unsigned int) x;
  }

  // Tableaux Attack & Decay Rate

  for (i = 0; i < 4; i++)
  {
    YM2612->AR_TAB[i] = 0;
    YM2612->DR_TAB[i] = 0;
  }

  for (i = 0; i < 60; i++)
  {
    x = YM2612->Frequence;

    x *= 1.0 + ((i & 3) * 0.25);                // bits 0-1 : x1.00, x1.25, x1.50, x1.75
    x *= (double) (1 << ((i >> 2)));            // bits 2-5 : shift bits (x2^0 - x2^15)
    x *= (double) (ENV_LENGTH << ENV_LBITS);    // on ajuste pour le tableau ENV_TAB

    YM2612->AR_TAB[i + 4] = (unsigned int) (x / AR_RATE);
    YM2612->DR_TAB[i + 4] = (unsigned int) (x / DR_RATE);
  }

  for (i = 64; i < 96; i++)
  {
    YM2612->AR_TAB[i] = YM2612->AR_TAB[63];
    YM2612->DR_TAB[i] = YM2612->DR_TAB[63];

    NULL_RATE[i - 64] = 0;
  }

  // Tableau Detune

  for (i = 0; i < 4; i++)
  {
    for (j = 0; j < 32; j++)
    {
      #if ((SIN_LBITS + SIN_HBITS - 21) < 0)
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence /
            (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
      #else
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence *
            (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
      #endif

      YM2612->DT_TAB[i + 0][j] = (int) x;
      YM2612->DT_TAB[i + 4][j] = (int) -x;
    }
  }

  // Tableau LFO

  j = (YM2612->Rate * YM2612->Inter_Step) / 0x4000;

  YM2612->LFO_INC_TAB[0] = (unsigned int) (3.98 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[1] = (unsigned int) (5.56 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[2] = (unsigned int) (6.02 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[3] = (unsigned int) (6.37 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[4] = (unsigned int) (6.88 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[5] = (unsigned int) (9.63 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[6] = (unsigned int) (48.1 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[7] = (unsigned int) (72.2 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);

  YM2612_SetMute(YM2612, 0x00);
  //YM2612_Reset(YM2612);

  return YM2612;
}